

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void fdct4x4_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  int iVar12;
  uint uVar13;
  int32_t *piVar14;
  char in_DL;
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i v [4];
  __m128i u [4];
  __m128i __rounding;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  int32_t *cospi;
  undefined2 uStack_3f4;
  undefined2 uStack_3f2;
  undefined2 uStack_3ec;
  undefined2 uStack_3ea;
  undefined2 uStack_3e4;
  undefined2 uStack_3e2;
  undefined2 uStack_3dc;
  undefined2 uStack_3da;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int iStack_154;
  int iStack_14c;
  int iStack_134;
  int iStack_12c;
  
  piVar14 = cospi_arr((int)in_DL);
  uVar11 = CONCAT22((short)piVar14[0x20],(short)piVar14[0x20]);
  auVar15._4_4_ = uVar11;
  auVar15._0_4_ = uVar11;
  auVar15._12_4_ = uVar11;
  auVar15._8_4_ = uVar11;
  iVar12 = (piVar14[0x20] & 0xffffU) + piVar14[0x20] * -0x10000;
  auVar16._4_4_ = iVar12;
  auVar16._0_4_ = iVar12;
  auVar16._12_4_ = iVar12;
  auVar16._8_4_ = iVar12;
  uVar13 = (uint)*(ushort *)(piVar14 + 0x10) | piVar14[0x30] << 0x10;
  auVar17._4_4_ = uVar13;
  auVar17._0_4_ = uVar13;
  auVar17._12_4_ = uVar13;
  auVar17._8_4_ = uVar13;
  iVar12 = (uint)*(ushort *)(piVar14 + 0x30) + piVar14[0x10] * -0x10000;
  auVar18._4_4_ = iVar12;
  auVar18._0_4_ = iVar12;
  auVar18._12_4_ = iVar12;
  auVar18._8_4_ = iVar12;
  iVar12 = 1 << (in_DL - 1U & 0x1f);
  uVar1 = *in_RDI;
  uVar2 = in_RDI[2];
  local_2b8 = (short)uVar1;
  sStack_2b6 = (short)((ulong)uVar1 >> 0x10);
  sStack_2b4 = (short)((ulong)uVar1 >> 0x20);
  sStack_2b2 = (short)((ulong)uVar1 >> 0x30);
  local_2c8 = (short)uVar2;
  sStack_2c6 = (short)((ulong)uVar2 >> 0x10);
  sStack_2c4 = (short)((ulong)uVar2 >> 0x20);
  sStack_2c2 = (short)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[4];
  uVar2 = in_RDI[6];
  local_2d8 = (short)uVar2;
  sStack_2d6 = (short)((ulong)uVar2 >> 0x10);
  sStack_2d4 = (short)((ulong)uVar2 >> 0x20);
  sStack_2d2 = (short)((ulong)uVar2 >> 0x30);
  local_2e8 = (short)uVar1;
  sStack_2e6 = (short)((ulong)uVar1 >> 0x10);
  sStack_2e4 = (short)((ulong)uVar1 >> 0x20);
  sStack_2e2 = (short)((ulong)uVar1 >> 0x30);
  auVar6._2_2_ = local_2c8 + local_2e8;
  auVar6._0_2_ = local_2b8 + local_2d8;
  auVar6._4_2_ = sStack_2b6 + sStack_2d6;
  auVar6._6_2_ = sStack_2c6 + sStack_2e6;
  auVar6._10_2_ = sStack_2c4 + sStack_2e4;
  auVar6._8_2_ = sStack_2b4 + sStack_2d4;
  auVar6._12_2_ = sStack_2b2 + sStack_2d2;
  auVar6._14_2_ = sStack_2c2 + sStack_2e2;
  auVar15 = pmaddwd(auVar6,auVar15);
  auVar5._2_2_ = local_2c8 + local_2e8;
  auVar5._0_2_ = local_2b8 + local_2d8;
  auVar5._4_2_ = sStack_2b6 + sStack_2d6;
  auVar5._6_2_ = sStack_2c6 + sStack_2e6;
  auVar5._10_2_ = sStack_2c4 + sStack_2e4;
  auVar5._8_2_ = sStack_2b4 + sStack_2d4;
  auVar5._12_2_ = sStack_2b2 + sStack_2d2;
  auVar5._14_2_ = sStack_2c2 + sStack_2e2;
  auVar16 = pmaddwd(auVar5,auVar16);
  auVar4._2_2_ = local_2c8 - local_2e8;
  auVar4._0_2_ = local_2b8 - local_2d8;
  auVar4._4_2_ = sStack_2b6 - sStack_2d6;
  auVar4._6_2_ = sStack_2c6 - sStack_2e6;
  auVar4._10_2_ = sStack_2c4 - sStack_2e4;
  auVar4._8_2_ = sStack_2b4 - sStack_2d4;
  auVar4._12_2_ = sStack_2b2 - sStack_2d2;
  auVar4._14_2_ = sStack_2c2 - sStack_2e2;
  auVar17 = pmaddwd(auVar4,auVar17);
  auVar3._2_2_ = local_2c8 - local_2e8;
  auVar3._0_2_ = local_2b8 - local_2d8;
  auVar3._4_2_ = sStack_2b6 - sStack_2d6;
  auVar3._6_2_ = sStack_2c6 - sStack_2e6;
  auVar3._10_2_ = sStack_2c4 - sStack_2e4;
  auVar3._8_2_ = sStack_2b4 - sStack_2d4;
  auVar3._12_2_ = sStack_2b2 - sStack_2d2;
  auVar3._14_2_ = sStack_2c2 - sStack_2e2;
  auVar18 = pmaddwd(auVar3,auVar18);
  local_1b8 = auVar15._0_4_;
  iStack_1b4 = auVar15._4_4_;
  iStack_1b0 = auVar15._8_4_;
  iStack_1ac = auVar15._12_4_;
  uStack_3f4 = (undefined2)(iStack_1b4 + iVar12);
  uStack_3f2 = (undefined2)((uint)(iStack_1b4 + iVar12) >> 0x10);
  uStack_3ec = (undefined2)(iStack_1ac + iVar12);
  uStack_3ea = (undefined2)((uint)(iStack_1ac + iVar12) >> 0x10);
  local_1d8 = auVar16._0_4_;
  iStack_1d4 = auVar16._4_4_;
  iStack_1d0 = auVar16._8_4_;
  iStack_1cc = auVar16._12_4_;
  uStack_3e4 = (undefined2)(iStack_1d4 + iVar12);
  uStack_3e2 = (undefined2)((uint)(iStack_1d4 + iVar12) >> 0x10);
  uStack_3dc = (undefined2)(iStack_1cc + iVar12);
  uStack_3da = (undefined2)((uint)(iStack_1cc + iVar12) >> 0x10);
  local_1f8 = auVar17._0_4_;
  iStack_1f4 = auVar17._4_4_;
  iStack_1f0 = auVar17._8_4_;
  iStack_1ec = auVar17._12_4_;
  local_218 = auVar18._0_4_;
  iStack_214 = auVar18._4_4_;
  iStack_210 = auVar18._8_4_;
  iStack_20c = auVar18._12_4_;
  iStack_134 = (int)(CONCAT26(uStack_3f2,CONCAT24(uStack_3f4,local_1b8 + iVar12)) >> 0x20);
  iStack_12c = (int)(CONCAT26(uStack_3ea,CONCAT24(uStack_3ec,iStack_1b0 + iVar12)) >> 0x20);
  auVar18 = ZEXT416((uint)(int)in_DL);
  local_3b8 = CONCAT44(iStack_134 >> auVar18,local_1b8 + iVar12 >> auVar18);
  uStack_3b0._0_4_ = iStack_1b0 + iVar12 >> auVar18;
  uStack_3b0._4_4_ = iStack_12c >> auVar18;
  iStack_154 = (int)(CONCAT26(uStack_3e2,CONCAT24(uStack_3e4,local_1d8 + iVar12)) >> 0x20);
  iStack_14c = (int)(CONCAT26(uStack_3da,CONCAT24(uStack_3dc,iStack_1d0 + iVar12)) >> 0x20);
  auVar18 = ZEXT416((uint)(int)in_DL);
  local_3a8 = CONCAT44(iStack_154 >> auVar18,local_1d8 + iVar12 >> auVar18);
  uStack_3a0._0_4_ = iStack_1d0 + iVar12 >> auVar18;
  uStack_3a0._4_4_ = iStack_14c >> auVar18;
  auVar18 = ZEXT416((uint)(int)in_DL);
  local_398 = CONCAT44(iStack_1f4 + iVar12 >> auVar18,local_1f8 + iVar12 >> auVar18);
  uStack_390._0_4_ = iStack_1f0 + iVar12 >> auVar18;
  uStack_390._4_4_ = iStack_1ec + iVar12 >> auVar18;
  auVar18 = ZEXT416((uint)(int)in_DL);
  local_388 = CONCAT44(iStack_214 + iVar12 >> auVar18,local_218 + iVar12 >> auVar18);
  uStack_380._0_4_ = iStack_210 + iVar12 >> auVar18;
  uStack_380._4_4_ = iStack_20c + iVar12 >> auVar18;
  auVar10._8_8_ = uStack_3b0;
  auVar10._0_8_ = local_3b8;
  auVar9._8_8_ = uStack_3a0;
  auVar9._0_8_ = local_3a8;
  auVar18 = packssdw(auVar10,auVar9);
  *in_RSI = auVar18;
  auVar8._8_8_ = uStack_390;
  auVar8._0_8_ = local_398;
  auVar7._8_8_ = uStack_380;
  auVar7._0_8_ = local_388;
  auVar18 = packssdw(auVar8,auVar7);
  in_RSI[1] = auVar18;
  *(undefined8 *)in_RSI[2] = *(undefined8 *)(*in_RSI + 8);
  *(undefined8 *)(in_RSI[2] + 8) = 0;
  *(undefined8 *)in_RSI[3] = *(undefined8 *)(in_RSI[1] + 8);
  *(undefined8 *)(in_RSI[3] + 8) = 0;
  return;
}

Assistant:

static void fdct4x4_new_sse2(const __m128i *input, __m128i *output,
                             int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  __m128i u[4], v[4];

  u[0] = _mm_unpacklo_epi16(input[0], input[1]);
  u[1] = _mm_unpacklo_epi16(input[3], input[2]);

  v[0] = _mm_add_epi16(u[0], u[1]);
  v[1] = _mm_sub_epi16(u[0], u[1]);

  u[0] = _mm_madd_epi16(v[0], cospi_p32_p32);  // 0
  u[1] = _mm_madd_epi16(v[0], cospi_p32_m32);  // 2
  u[2] = _mm_madd_epi16(v[1], cospi_p16_p48);  // 1
  u[3] = _mm_madd_epi16(v[1], cospi_p48_m16);  // 3

  v[0] = _mm_add_epi32(u[0], __rounding);
  v[1] = _mm_add_epi32(u[1], __rounding);
  v[2] = _mm_add_epi32(u[2], __rounding);
  v[3] = _mm_add_epi32(u[3], __rounding);
  u[0] = _mm_srai_epi32(v[0], cos_bit);
  u[1] = _mm_srai_epi32(v[1], cos_bit);
  u[2] = _mm_srai_epi32(v[2], cos_bit);
  u[3] = _mm_srai_epi32(v[3], cos_bit);

  output[0] = _mm_packs_epi32(u[0], u[1]);
  output[1] = _mm_packs_epi32(u[2], u[3]);
  output[2] = _mm_srli_si128(output[0], 8);
  output[3] = _mm_srli_si128(output[1], 8);
}